

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O2

void __thiscall
singleParticleSpectra::calculate_Qn_vector_positive_charge
          (singleParticleSpectra *this,int event_id,
          vector<double,_std::allocator<double>_> *event_Qn_real,
          vector<double,_std::allocator<double>_> *event_Qn_real_err,
          vector<double,_std::allocator<double>_> *event_Qn_imag,
          vector<double,_std::allocator<double>_> *event_Qn_imag_err,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_real,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_real_err,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_imag,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *event_Qn_diff_imag_err)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pvVar5;
  pointer pvVar6;
  pointer pvVar7;
  pointer pvVar8;
  vector<particle_info,_std::allocator<particle_info>_> *pvVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int j;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  int iorder;
  double dVar18;
  double dVar19;
  double dVar20;
  
  pdVar1 = (event_Qn_real->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (event_Qn_real_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = 0;
  uVar16 = (ulong)(uint)this->npT;
  if (this->npT < 1) {
    uVar16 = uVar12;
  }
  uVar15 = (ulong)(uint)this->order_max;
  if (this->order_max < 1) {
    uVar15 = uVar12;
  }
  pdVar3 = (event_Qn_imag->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar4 = (event_Qn_imag_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (; uVar12 != uVar15; uVar12 = uVar12 + 1) {
    pdVar1[uVar12] = 0.0;
    pdVar2[uVar12] = 0.0;
    pdVar3[uVar12] = 0.0;
    pdVar4[uVar12] = 0.0;
    pvVar5 = (event_Qn_diff_real->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar6 = (event_Qn_diff_real_err->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar7 = (event_Qn_diff_imag->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar8 = (event_Qn_diff_imag_err->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (uVar14 = 0; uVar16 != uVar14; uVar14 = uVar14 + 1) {
      *(undefined8 *)
       (*(long *)&pvVar5[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + uVar14 * 8) = 0;
      *(undefined8 *)
       (*(long *)&pvVar6[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + uVar14 * 8) = 0;
      *(undefined8 *)
       (*(long *)&pvVar7[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + uVar14 * 8) = 0;
      *(undefined8 *)
       (*(long *)&pvVar8[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + uVar14 * 8) = 0;
    }
  }
  pvVar9 = (((this->particle_list).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->positive_charge_hadron_list->
           super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
           )._M_impl.super__Vector_impl_data._M_start[event_id];
  uVar12 = ((long)*(pointer *)
                   ((long)&pvVar9->super__Vector_base<particle_info,_std::allocator<particle_info>_>
                   + 8) -
           *(long *)&pvVar9->super__Vector_base<particle_info,_std::allocator<particle_info>_>) /
           0x78;
  uVar15 = 0;
  uVar16 = uVar12 & 0xffffffff;
  if ((int)uVar12 < 1) {
    uVar16 = uVar15;
  }
  for (; uVar15 != uVar16; uVar15 = uVar15 + 1) {
    lVar17 = *(long *)&(((this->particle_list).
                         super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        positive_charge_hadron_list->
                       super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                       )._M_impl.super__Vector_impl_data._M_start[event_id]->
                       super__Vector_base<particle_info,_std::allocator<particle_info>_>;
    lVar13 = uVar15 * 0x78;
    dVar19 = *(double *)(lVar17 + 0x28 + lVar13);
    dVar18 = *(double *)(lVar17 + 0x30 + lVar13);
    if (this->rap_type == 0) {
      dVar20 = *(double *)(lVar17 + lVar13 + 8);
      dVar18 = dVar18 * dVar18 - dVar20 * dVar20;
      if (dVar18 < 0.0) {
        dVar18 = sqrt(dVar18);
      }
      else {
        dVar18 = SQRT(dVar18);
      }
    }
    dVar19 = log((dVar19 + dVar18) / (dVar18 - dVar19));
    dVar19 = dVar19 * 0.5;
    if ((this->rap_min <= dVar19 && dVar19 != this->rap_min) && (dVar19 < this->rap_max)) {
      lVar17 = *(long *)&(((this->particle_list).
                           super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          positive_charge_hadron_list->
                         super__Vector_base<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                         )._M_impl.super__Vector_impl_data._M_start[event_id]->
                         super__Vector_base<particle_info,_std::allocator<particle_info>_>;
      dVar19 = *(double *)(lVar17 + 0x18 + lVar13);
      dVar18 = *(double *)(lVar17 + 0x20 + lVar13);
      dVar20 = SQRT(dVar19 * dVar19 + dVar18 * dVar18);
      if ((this->vn_rapidity_dis_pT_min <= dVar20 && dVar20 != this->vn_rapidity_dis_pT_min) &&
         (dVar20 < this->vn_rapidity_dis_pT_max)) {
        dVar19 = atan2(dVar18,dVar19);
        uVar11 = (uint)((dVar20 - this->pT_min) / this->dpT);
        if ((-1 < (int)uVar11) && ((int)uVar11 < this->npT)) {
          uVar12 = (ulong)uVar11;
          lVar17 = 0;
          for (lVar13 = 0; lVar13 < this->order_max; lVar13 = lVar13 + 1) {
            dVar18 = (double)(int)lVar13 * dVar19;
            dVar20 = cos(dVar18);
            dVar18 = sin(dVar18);
            pdVar1 = (event_Qn_real->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar1[lVar13] = pdVar1[lVar13] + dVar20;
            pdVar1 = (event_Qn_imag->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar1[lVar13] = pdVar1[lVar13] + dVar18;
            pdVar1 = (event_Qn_real_err->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            pdVar1[lVar13] = pdVar1[lVar13] + dVar20 * dVar20;
            pdVar1 = (event_Qn_imag_err->super__Vector_base<double,_std::allocator<double>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            pdVar1[lVar13] = pdVar1[lVar13] + dVar18 * dVar18;
            lVar10 = *(long *)((long)&(((event_Qn_diff_real->
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data + lVar17);
            *(double *)(lVar10 + uVar12 * 8) = dVar20 + *(double *)(lVar10 + uVar12 * 8);
            lVar10 = *(long *)((long)&(((event_Qn_diff_imag->
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data + lVar17);
            *(double *)(lVar10 + uVar12 * 8) = dVar18 + *(double *)(lVar10 + uVar12 * 8);
            lVar10 = *(long *)((long)&(((event_Qn_diff_real_err->
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data + lVar17);
            *(double *)(lVar10 + uVar12 * 8) = dVar20 * dVar20 + *(double *)(lVar10 + uVar12 * 8);
            lVar10 = *(long *)((long)&(((event_Qn_diff_imag_err->
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data + lVar17);
            *(double *)(lVar10 + uVar12 * 8) = dVar18 * dVar18 + *(double *)(lVar10 + uVar12 * 8);
            lVar17 = lVar17 + 0x18;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void singleParticleSpectra::calculate_Qn_vector_positive_charge(
    int event_id, vector<double> &event_Qn_real,
    vector<double> &event_Qn_real_err, vector<double> &event_Qn_imag,
    vector<double> &event_Qn_imag_err,
    vector<vector<double>> &event_Qn_diff_real,
    vector<vector<double>> &event_Qn_diff_real_err,
    vector<vector<double>> &event_Qn_diff_imag,
    vector<vector<double>> &event_Qn_diff_imag_err) {
    // first clean the results arrays
    for (int i = 0; i < order_max; i++) {
        event_Qn_real[i] = 0.0;
        event_Qn_real_err[i] = 0.0;
        event_Qn_imag[i] = 0.0;
        event_Qn_imag_err[i] = 0.0;
        for (int j = 0; j < npT; j++) {
            event_Qn_diff_real[i][j] = 0.0;
            event_Qn_diff_real_err[i][j] = 0.0;
            event_Qn_diff_imag[i][j] = 0.0;
            event_Qn_diff_imag_err[i][j] = 0.0;
        }
    }

    int number_of_particles =
        (particle_list->get_number_of_positive_particles(event_id));
    for (int i = 0; i < number_of_particles; i++) {
        double pz_local = particle_list->get_positive_particle(event_id, i).pz;
        double E_local = particle_list->get_positive_particle(event_id, i).E;

        double rap_local;
        if (rap_type == 0) {
            double mass =
                (particle_list->get_positive_particle(event_id, i).mass);
            double pmag = sqrt(E_local * E_local - mass * mass);
            rap_local = 0.5 * log((pmag + pz_local) / (pmag - pz_local));
        } else {
            rap_local = 0.5 * log((E_local + pz_local) / (E_local - pz_local));
        }

        if (rap_local > rap_min && rap_local < rap_max) {
            double px_local =
                (particle_list->get_positive_particle(event_id, i).px);
            double py_local =
                (particle_list->get_positive_particle(event_id, i).py);
            double p_perp = sqrt(px_local * px_local + py_local * py_local);
            if (p_perp > vn_rapidity_dis_pT_min
                && p_perp < vn_rapidity_dis_pT_max) {
                double p_phi = atan2(py_local, px_local);
                int p_idx = static_cast<int>((p_perp - pT_min) / dpT);
                if (p_idx < 0 || p_idx >= npT) continue;
                for (int iorder = 0; iorder < order_max; iorder++) {
                    double cos_nphi = cos(iorder * p_phi);
                    double sin_nphi = sin(iorder * p_phi);
                    event_Qn_real[iorder] += cos_nphi;
                    event_Qn_imag[iorder] += sin_nphi;
                    event_Qn_real_err[iorder] += cos_nphi * cos_nphi;
                    event_Qn_imag_err[iorder] += sin_nphi * sin_nphi;
                    event_Qn_diff_real[iorder][p_idx] += cos_nphi;
                    event_Qn_diff_imag[iorder][p_idx] += sin_nphi;
                    event_Qn_diff_real_err[iorder][p_idx] +=
                        cos_nphi * cos_nphi;
                    event_Qn_diff_imag_err[iorder][p_idx] +=
                        sin_nphi * sin_nphi;
                }
            }
        }
    }
}